

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

uint xmlDictHashQName(uint seed,xmlChar *prefix,xmlChar *name,size_t *pplen,size_t *plen)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  
  uVar1 = seed ^ 0x3b00;
  uVar3 = seed << 0xf | seed >> 0x11;
  for (sVar4 = 0; prefix[sVar4] != 0; sVar4 = sVar4 + 1) {
    uVar1 = (uVar1 + prefix[sVar4]) * 9;
    uVar3 = ((uVar3 + uVar1) * 0x80 | uVar3 + uVar1 >> 0x19) * 5;
  }
  *pplen = sVar4;
  uVar2 = uVar1 * 9 + 0x20a;
  uVar1 = uVar3 + uVar1 * 9 + 0x20a;
  uVar1 = uVar1 * 0x80 | uVar1 >> 0x19;
  sVar4 = 0;
  while( true ) {
    uVar3 = uVar1 * 5;
    if (name[sVar4] == 0) break;
    uVar2 = (uVar2 + name[sVar4]) * 9;
    uVar1 = (uVar3 + uVar2) * 0x80 | uVar3 + uVar2 >> 0x19;
    sVar4 = sVar4 + 1;
  }
  uVar1 = (uVar1 * 0x14000 | uVar3 >> 0x12) + (uVar2 ^ uVar3);
  uVar3 = (uVar1 * 0x4000000 | uVar1 >> 6) + (uVar3 ^ uVar1);
  uVar1 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 ^ uVar3);
  *plen = sVar4;
  return (uVar1 * 0x1000000 | uVar1 >> 8) + (uVar3 ^ uVar1) | 0x80000000;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static unsigned
xmlDictHashQName(unsigned seed, const xmlChar *prefix, const xmlChar *name,
                 size_t *pplen, size_t *plen) {
    unsigned h1, h2;
    size_t i;

    HASH_INIT(h1, h2, seed);

    for (i = 0; prefix[i] != 0; i++) {
        HASH_UPDATE(h1, h2, prefix[i]);
    }
    *pplen = i;

    HASH_UPDATE(h1, h2, ':');

    for (i = 0; name[i] != 0; i++) {
        HASH_UPDATE(h1, h2, name[i]);
    }
    *plen = i;

    HASH_FINISH(h1, h2);

    /*
     * Always set the upper bit of hash values since 0 means an unoccupied
     * bucket.
     */
    return(h2 | MAX_HASH_SIZE);
}